

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

bool __thiscall dap::Deserializer::field<dap::integer>(Deserializer *this,string *name,integer *v)

{
  int iVar1;
  anon_class_8_1_54a39816 local_48;
  function<bool_(dap::Deserializer_*)> local_40;
  integer *local_20;
  integer *v_local;
  string *name_local;
  Deserializer *this_local;
  
  local_48.v = &local_20;
  local_20 = v;
  v_local = (integer *)name;
  name_local = (string *)this;
  std::function<bool(dap::Deserializer*)>::
  function<dap::Deserializer::field<dap::integer>(std::__cxx11::string_const&,dap::integer*)const::_lambda(dap::Deserializer_const*)_1_,void>
            ((function<bool(dap::Deserializer*)> *)&local_40,&local_48);
  iVar1 = (*this->_vptr_Deserializer[10])(this,name,&local_40);
  std::function<bool_(dap::Deserializer_*)>::~function(&local_40);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool Deserializer::field(const std::string& name, T* v) const {
  return this->field(name,
                     [&](const Deserializer* d) { return d->deserialize(v); });
}